

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void printPartStats(ostream *out,partStats *data,string *indent,int timing,bool raw,bool stats)

{
  bool bVar1;
  ostream *poVar2;
  
  if ((timing & 1U) == 0) {
    bVar1 = false;
  }
  else {
    if ((data->sizeData).isDeep == true) {
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,(indent->_M_dataplus)._M_p,indent->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"count read time\": ",0x13);
      printTiming(&data->countReadPerf,out,raw,stats);
      std::__ostream_insert<char,std::char_traits<char>>(out,",\n",2);
    }
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,(indent->_M_dataplus)._M_p,indent->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"read time\": ",0xd);
    printTiming(&data->readPerf,out,raw,stats);
    bVar1 = true;
  }
  if ((timing & 2U) != 0) {
    if (bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>(out,",\n",2);
    }
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,(indent->_M_dataplus)._M_p,indent->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"write time\": ",0xe);
    printTiming(&data->writePerf,out,raw,stats);
    bVar1 = true;
  }
  if ((timing & 4U) == 0) {
    return;
  }
  if ((data->sizeData).isDeep == true) {
    if (bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>(out,",\n",2);
    }
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,(indent->_M_dataplus)._M_p,indent->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"count re-read time\": ",0x16);
    printTiming(&data->countRereadPerf,out,raw,stats);
  }
  else if (!bVar1) goto LAB_0010648b;
  std::__ostream_insert<char,std::char_traits<char>>(out,",\n",2);
LAB_0010648b:
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(indent->_M_dataplus)._M_p,indent->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"re-read time\": ",0x10);
  printTiming(&data->rereadPerf,out,raw,stats);
  return;
}

Assistant:

void
printPartStats (
    ostream&         out,
    const partStats& data,
    const string     indent,
    int              timing,
    bool             raw,
    bool             stats)
{
    bool output = false;
    if (timing & options::TIME_READ)
    {
        if (data.sizeData.isDeep)
        {
            out << indent << "\"count read time\": ";
            printTiming (data.countReadPerf, out, raw, stats);
            output = true;
        }
        if (output) { out << ",\n"; }
        out << indent << "\"read time\": ";
        printTiming (data.readPerf, out, raw, stats);
        output = true;
    }

    if (timing & options::TIME_WRITE)
    {
        if (output) { out << ",\n"; }
        output = true;
        out << indent << "\"write time\": ";
        printTiming (data.writePerf, out, raw, stats);
    }

    if (timing & options::TIME_REREAD)
    {
        if (data.sizeData.isDeep)
        {
            if (output) { out << ",\n"; }
            output = true;
            out << indent << "\"count re-read time\": ";
            printTiming (data.countRereadPerf, out, raw, stats);
        }
        if (output) { out << ",\n"; }
        output = true;
        out << indent << "\"re-read time\": ";
        printTiming (data.rereadPerf, out, raw, stats);
    }
}